

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::XmlReporter::writeSourceInfo(XmlReporter *this,SourceLineInfo *sourceInfo)

{
  XmlWriter *this_00;
  allocator<char> local_5a;
  allocator<char> local_59;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"filename",&local_59);
  this_00 = XmlWriter::writeAttribute<char_const*>(&this->m_xml,&local_38,&sourceInfo->file);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"line",&local_5a);
  XmlWriter::writeAttribute<unsigned_long>(this_00,&local_58,&sourceInfo->line);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void XmlReporter::writeSourceInfo( SourceLineInfo const& sourceInfo ) {
        m_xml
            .writeAttribute( "filename", sourceInfo.file )
            .writeAttribute( "line", sourceInfo.line );
    }